

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record.hpp
# Opt level: O3

void __thiscall Excel::RecordSubstream::seek(RecordSubstream *this,int32_t pos,SeekType type)

{
  std::istream::seekg((long)&this->m_stream,pos);
  return;
}

Assistant:

inline void
RecordSubstream::seek( int32_t pos, SeekType type )
{
	std::ios::seekdir dir;

	if( type == Stream::FromBeginning )
		dir = std::ios::beg;
	else if( type == Stream::FromCurrent )
		dir = std::ios::cur;
	else
		dir = std::ios::end;

	m_stream.seekg( pos, dir );
}